

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O0

type boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
               (JointPolicyPureVectorForClusteredBG *arg1)

{
  sp_ms_deleter<JointPolicyPureVectorForClusteredBG> *this;
  void *pvVar1;
  shared_count extraout_RDX;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  element_type *in_RDI;
  type tVar2;
  JointPolicyPureVectorForClusteredBG *pt2;
  void *pv;
  sp_ms_deleter<JointPolicyPureVectorForClusteredBG> *pd;
  shared_ptr<JointPolicyPureVectorForClusteredBG> pt;
  JointPolicyPureVectorForClusteredBG *in_stack_ffffffffffffff88;
  element_type *this_00;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_20;
  JointPolicyPureVectorForClusteredBG *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  shared_ptr<JointPolicyPureVectorForClusteredBG>::
  shared_ptr<JointPolicyPureVectorForClusteredBG,boost::detail::sp_inplace_tag<boost::detail::sp_ms_deleter<JointPolicyPureVectorForClusteredBG>>>
            (&local_20,0);
  this = (sp_ms_deleter<JointPolicyPureVectorForClusteredBG> *)
         shared_ptr<JointPolicyPureVectorForClusteredBG>::_internal_get_untyped_deleter
                   ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)this_00);
  pvVar1 = detail::sp_ms_deleter<JointPolicyPureVectorForClusteredBG>::address(this);
  detail::sp_forward<JointPolicyPureVectorForClusteredBG&>(local_10);
  JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
            (this_00,in_stack_ffffffffffffff88);
  detail::sp_ms_deleter<JointPolicyPureVectorForClusteredBG>::set_initialized(this);
  detail::sp_enable_shared_from_this(&local_20,pvVar1,pvVar1);
  shared_ptr<JointPolicyPureVectorForClusteredBG>::shared_ptr<JointPolicyPureVectorForClusteredBG>
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)this_00,
             (shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffff88,
             (element_type *)0x96f1bd);
  shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96f1c7);
  tVar2.pn.pi_ = extraout_RDX.pi_;
  tVar2.px = in_RDI;
  return tVar2;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Arg1 && arg1, Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Arg1>( arg1 ), boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}